

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapOneofField
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  int key;
  OneofDescriptor *pOVar2;
  long lVar3;
  Type TVar4;
  uint uVar5;
  uint uVar6;
  uint32 uVar7;
  ulong uVar8;
  FieldDescriptor *this_00;
  double *pdVar9;
  unsigned_long *puVar10;
  uint *puVar11;
  float *pfVar12;
  bool *pbVar13;
  LogMessage *pLVar14;
  FieldDescriptor *this_01;
  Message *sub_message;
  unsigned_long uVar15;
  string temp_string;
  LogFinisher local_ca;
  undefined1 local_c9;
  LogMessage *local_c8;
  double local_c0;
  uint local_b4;
  float local_b0;
  uint local_ac;
  uint local_a8;
  int local_a4;
  undefined1 local_a0 [56];
  string local_68;
  double local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  uVar8 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                     *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) >> 4) *
                        -0x55555554 + (this->schema_).oneof_case_offset_);
  local_a4 = *(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar8);
  key = *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar8);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (local_a4 == 0) {
    this_00 = (FieldDescriptor *)0x0;
    local_c8 = (LogMessage *)0x0;
    goto LAB_00314c14;
  }
  this_00 = Descriptor::FindFieldByNumber(this->descriptor_,local_a4);
  TVar4 = FieldDescriptor::type(this_00);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4)) {
  case 1:
    puVar11 = (uint *)GetRaw<int>(this,message1,this_00);
    local_a8 = *puVar11;
    local_c8 = (LogMessage *)0x0;
    break;
  case 2:
    puVar10 = (unsigned_long *)GetRaw<long>(this,message1,this_00);
    local_38 = *puVar10;
    local_c8 = (LogMessage *)0x0;
    break;
  case 3:
    puVar11 = GetRaw<unsigned_int>(this,message1,this_00);
    local_ac = *puVar11;
    local_c8 = (LogMessage *)0x0;
    break;
  case 4:
    puVar10 = GetRaw<unsigned_long>(this,message1,this_00);
    local_40 = *puVar10;
    local_c8 = (LogMessage *)0x0;
    break;
  case 5:
    pdVar9 = GetRaw<double>(this,message1,this_00);
    local_48 = *pdVar9;
    goto LAB_00314b39;
  case 6:
    pfVar12 = GetRaw<float>(this,message1,this_00);
    local_b0 = *pfVar12;
LAB_00314b39:
    local_c8 = (LogMessage *)0x0;
    break;
  case 7:
    pbVar13 = GetRaw<bool>(this,message1,this_00);
    local_c9 = *pbVar13;
    local_c8 = (LogMessage *)0x0;
    break;
  case 8:
    puVar11 = (uint *)GetRaw<int>(this,message1,this_00);
    local_b4 = *puVar11;
    local_c8 = (LogMessage *)0x0;
    break;
  case 9:
    GetString_abi_cxx11_((string *)local_a0,this,message1,this_00);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    goto LAB_00314c0b;
  case 10:
    local_c8 = (LogMessage *)ReleaseMessage(this,message1,this_00,(MessageFactory *)0x0);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x204);
    local_c8 = LogMessage::operator<<((LogMessage *)local_a0,"Unimplemented type: ");
    TVar4 = FieldDescriptor::type(this_00);
    pLVar14 = LogMessage::operator<<
                        (local_c8,*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4));
    LogFinisher::operator=(&local_ca,pLVar14);
    LogMessage::~LogMessage((LogMessage *)local_a0);
LAB_00314c0b:
    local_c8 = (LogMessage *)0x0;
  }
LAB_00314c14:
  if (key == 0) {
    ClearOneof(this,message1,oneof_descriptor);
    goto LAB_00315099;
  }
  this_01 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  TVar4 = FieldDescriptor::type(this_01);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4)) {
  case 1:
    puVar11 = (uint *)GetRaw<int>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar5 = *puVar11;
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    goto LAB_00314e78;
  case 2:
    puVar10 = (unsigned_long *)GetRaw<long>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar15 = *puVar10;
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    goto LAB_00314edd;
  case 3:
    puVar11 = GetRaw<unsigned_int>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar5 = *puVar11;
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    goto LAB_00314e78;
  case 4:
    puVar10 = GetRaw<unsigned_long>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar15 = *puVar10;
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
LAB_00314edd:
    *(unsigned_long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
         uVar15;
    break;
  case 5:
    pdVar9 = GetRaw<double>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    local_c0 = *pdVar9;
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    *(double *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = local_c0;
    break;
  case 6:
    pfVar12 = GetRaw<float>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    local_c0 = (double)CONCAT44(local_c0._4_4_,*pfVar12);
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) =
         local_c0._0_4_;
    break;
  case 7:
    pbVar13 = GetRaw<bool>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    bVar1 = *pbVar13;
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    *(bool *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = bVar1;
    break;
  case 8:
    puVar11 = (uint *)GetRaw<int>(this,message2,this_01);
    pOVar2 = *(OneofDescriptor **)(this_01 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_01 + 0x38))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar5 = *puVar11;
    uVar6 = ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
LAB_00314e78:
    *(uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = uVar5;
    break;
  case 9:
    GetString_abi_cxx11_((string *)local_a0,this,message2,this_01);
    SetString(this,message1,this_01,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    goto LAB_00315099;
  case 10:
    sub_message = ReleaseMessage(this,message2,this_01,(MessageFactory *)0x0);
    SetAllocatedMessage(this,message1,sub_message,this_01);
    goto LAB_00315099;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x226);
    pLVar14 = LogMessage::operator<<((LogMessage *)local_a0,"Unimplemented type: ");
    TVar4 = FieldDescriptor::type(this_01);
    pLVar14 = LogMessage::operator<<
                        (pLVar14,*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4));
    LogFinisher::operator=(&local_ca,pLVar14);
    LogMessage::~LogMessage((LogMessage *)local_a0);
    goto LAB_00315099;
  }
  lVar3 = *(long *)(this_01 + 0x60);
  if (lVar3 == 0) {
    SetBit(this,message1,this_01);
  }
  else {
    *(undefined4 *)
     ((long)&(message1->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x40)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) =
         *(undefined4 *)(this_01 + 0x38);
  }
LAB_00315099:
  if (local_a4 == 0) {
    ClearOneof(this,message2,oneof_descriptor);
    goto LAB_00315473;
  }
  TVar4 = FieldDescriptor::type(this_00);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4)) {
  case 1:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    uVar8 = (ulong)uVar7;
    uVar5 = local_a8;
    goto LAB_003152b8;
  case 2:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    uVar15 = local_38;
    goto LAB_00315315;
  case 3:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    uVar8 = (ulong)uVar7;
    uVar5 = local_ac;
    goto LAB_003152b8;
  case 4:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    uVar15 = local_40;
LAB_00315315:
    *(unsigned_long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
         uVar15;
    break;
  case 5:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    *(double *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = local_48;
    break;
  case 6:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    *(float *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = local_b0;
    break;
  case 7:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) =
         local_c9;
    break;
  case 8:
    pOVar2 = *(OneofDescriptor **)(this_00 + 0x60);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x40)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(this_00 + 0x38))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar7 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
    uVar8 = (ulong)uVar7;
    uVar5 = local_b4;
LAB_003152b8:
    *(uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar8) = uVar5;
    break;
  case 9:
    SetString(this,message2,this_00,&local_68);
    goto LAB_00315473;
  case 10:
    SetAllocatedMessage(this,message2,(Message *)local_c8,this_00);
    goto LAB_00315473;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x246);
    pLVar14 = LogMessage::operator<<((LogMessage *)local_a0,"Unimplemented type: ");
    TVar4 = FieldDescriptor::type(this_00);
    pLVar14 = LogMessage::operator<<
                        (pLVar14,*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4));
    LogFinisher::operator=(&local_ca,pLVar14);
    LogMessage::~LogMessage((LogMessage *)local_a0);
    goto LAB_00315473;
  }
  lVar3 = *(long *)(this_00 + 0x60);
  if (lVar3 == 0) {
    SetBit(this,message2,this_00);
  }
  else {
    *(undefined4 *)
     ((long)&(message2->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x40)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) =
         *(undefined4 *)(this_00 + 0x38);
  }
LAB_00315473:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapOneofField(
    Message* message1,
    Message* message2,
    const OneofDescriptor* oneof_descriptor) const {
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = NULL;
  string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = NULL;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    //oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                                   \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        temp_##TYPE = GetField<TYPE>(*message1, field1);                \
        break;

      GET_TEMP_VALUE(INT32 , int32 );
      GET_TEMP_VALUE(INT64 , int64 );
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT , float );
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL  , bool  );
      GET_TEMP_VALUE(ENUM  , int   );
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 =
        descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                 \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
        break;

      SET_ONEOF_VALUE1(INT32 , int32 );
      SET_ONEOF_VALUE1(INT64 , int64 );
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT , float );
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL  , bool  );
      SET_ONEOF_VALUE1(ENUM  , int   );
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1,
                            ReleaseMessage(message2, field2),
                            field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)                                 \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        SetField<TYPE>(message2, field1, temp_##TYPE);                  \
        break;

      SET_ONEOF_VALUE2(INT32 , int32 );
      SET_ONEOF_VALUE2(INT64 , int64 );
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT , float );
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL  , bool  );
      SET_ONEOF_VALUE2(ENUM  , int   );
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}